

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> __thiscall
fmt::v8::detail::digit_grouping<char16_t>::
apply<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char>
          (digit_grouping<char16_t> *this,
          back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,
          basic_string_view<char> digits)

{
  ulong uVar1;
  char16_t cVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  char *pcVar8;
  int iVar9;
  undefined4 *puVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  undefined **local_828;
  undefined4 *local_820;
  ulong local_818;
  ulong local_810;
  undefined4 local_808 [502];
  
  uVar5 = digits.size_;
  puVar10 = local_808;
  local_828 = &PTR_grow_001b38f0;
  local_810 = 500;
  local_818 = 1;
  local_808[0] = 0;
  cVar2 = (this->sep_).thousands_sep;
  uVar11 = (uint)digits.size_;
  local_820 = puVar10;
  if (cVar2 != L'\0') {
    pcVar12 = (this->sep_).grouping._M_dataplus._M_p;
    iVar9 = 0;
    do {
      pcVar8 = (this->sep_).grouping._M_dataplus._M_p + (this->sep_).grouping._M_string_length;
      if (pcVar12 == pcVar8) {
        cVar7 = pcVar8[-1];
      }
      else {
        cVar7 = *pcVar12;
        if ((byte)(cVar7 + 0x81U) < 0x82) goto LAB_00160431;
        pcVar12 = pcVar12 + 1;
      }
      iVar9 = iVar9 + cVar7;
      if ((iVar9 == 0) || ((int)uVar11 <= iVar9)) goto LAB_00160431;
      uVar3 = local_818 + 1;
      if (local_810 < uVar3) {
        (*(code *)*local_828)(&local_828,uVar3);
        uVar3 = local_818 + 1;
        cVar2 = (this->sep_).thousands_sep;
        puVar10 = local_820;
      }
      puVar10[local_818] = iVar9;
      local_818 = uVar3;
      if (cVar2 == L'\0') goto LAB_00160431;
    } while( true );
  }
  iVar9 = 0;
LAB_0016043c:
  if (0 < (int)uVar11) {
    uVar3 = (out.container)->size_;
    uVar13 = 0;
    do {
      uVar6 = (out.container)->capacity_;
      if ((int)uVar5 == local_820[iVar9]) {
        cVar2 = (this->sep_).thousands_sep;
        uVar1 = uVar3 + 1;
        uVar4 = uVar3;
        uVar3 = uVar1;
        if (uVar6 < uVar1) {
          (**(out.container)->_vptr_buffer)(out.container);
          uVar4 = (out.container)->size_;
          uVar6 = (out.container)->capacity_;
          uVar3 = uVar4 + 1;
        }
        (out.container)->size_ = uVar3;
        (out.container)->ptr_[uVar4] = cVar2;
        iVar9 = iVar9 + -1;
      }
      cVar7 = digits.data_[uVar13];
      uVar1 = uVar3 + 1;
      uVar4 = uVar3;
      uVar3 = uVar1;
      if (uVar6 < uVar1) {
        (**(out.container)->_vptr_buffer)(out.container);
        uVar4 = (out.container)->size_;
        uVar3 = uVar4 + 1;
      }
      (out.container)->size_ = uVar3;
      (out.container)->ptr_[uVar4] = (short)cVar7;
      uVar13 = uVar13 + 1;
      uVar5 = (ulong)((int)uVar5 - 1);
      puVar10 = local_820;
    } while ((uVar11 & 0x7fffffff) != uVar13);
  }
  if (puVar10 != local_808) {
    operator_delete(puVar10,local_810 << 2);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
LAB_00160431:
  iVar9 = (int)local_818 + -1;
  goto LAB_0016043c;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        *out++ = separator();
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }